

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall Hospital::Show_Doctors_Timetable(Hospital *this)

{
  ostream *poVar1;
  long lVar2;
  int j;
  ulong uVar3;
  int i;
  ulong uVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_130;
  allocator local_12f;
  allocator local_12e;
  allocator local_12d;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  days;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&local_110," Monday   ",&local_129);
  std::__cxx11::string::string(local_f0," Tuesday   ",&local_12a);
  std::__cxx11::string::string(local_d0," Wednesday",&local_12b);
  std::__cxx11::string::string(local_b0," Thursday ",&local_12c);
  std::__cxx11::string::string(local_90," Friday   ",&local_12d);
  std::__cxx11::string::string(local_70," Saturday ",&local_12e);
  std::__cxx11::string::string(local_50," Sunday   ",&local_12f);
  __l._M_len = 7;
  __l._M_array = &local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&days,__l,&local_130);
  lVar2 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_110._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  poVar1 = std::operator<<((ostream *)&std::cout,"         ");
  poVar1 = std::operator<<(poVar1,"  8->12  ");
  poVar1 = std::operator<<(poVar1,"  12->16  ");
  poVar1 = std::operator<<(poVar1,"  16->20  ");
  poVar1 = std::operator<<(poVar1,"  20->24  ");
  poVar1 = std::operator<<(poVar1,"  24->4  ");
  poVar1 = std::operator<<(poVar1,"  4->8  ");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)Doctors_Timetable_abi_cxx11_.
                             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)Doctors_Timetable_abi_cxx11_.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&std::cout,
                    (string *)
                    (days.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar4));
    lVar2 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)((Doctors_Timetable_abi_cxx11_.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)((Doctors_Timetable_abi_cxx11_.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&std::cout,
                      (string *)
                      ((long)&((Doctors_Timetable_abi_cxx11_.
                                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar2));
      lVar2 = lVar2 + 0x20;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&days);
  return;
}

Assistant:

void Hospital :: Show_Doctors_Timetable() {
  //  Table table;

  //  table.add_row({ "         ","  8->12  ","  12->16  ","  16->20  ","  20->24  ","  24->4  ","  4->8  "});



    vector< string >days {" Monday   "," Tuesday   "," Wednesday"," Thursday "," Friday   "," Saturday "," Sunday   "};
  cout <<"         "<<"  8->12  "<<"  12->16  "<<"  16->20  "<<"  20->24  "<<"  24->4  "<<"  4->8  "<<endl;
   // Table Doctors_Timetable;
    for (int i = 0; i <Doctors_Timetable.size() ; ++i) {
        cout <<days[i];
        for (int j = 0; j <Doctors_Timetable[0].size() ; ++j) {
          //  table.add_row({days[i],Doctors_Timetable[i][0],Doctors_Timetable[i][1],Doctors_Timetable[i][2],Doctors_Timetable[i][3],Doctors_Timetable[i][4],Doctors_Timetable[i][5]});
           cout <<Doctors_Timetable[i][j];
        }
       cout << endl;
    }

   // cout << table <<endl;
}